

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deconvolutiondepthwise.cpp
# Opt level: O2

int __thiscall ncnn::DeconvolutionDepthWise::load_param(DeconvolutionDepthWise *this,ParamDict *pd)

{
  Allocator *pAVar1;
  int iVar2;
  int *piVar3;
  Mat local_b8;
  Mat local_68;
  
  iVar2 = ParamDict::get(pd,0,0);
  this->num_output = iVar2;
  iVar2 = ParamDict::get(pd,1,0);
  this->kernel_w = iVar2;
  iVar2 = ParamDict::get(pd,0xb,iVar2);
  this->kernel_h = iVar2;
  iVar2 = ParamDict::get(pd,2,1);
  this->dilation_w = iVar2;
  iVar2 = ParamDict::get(pd,0xc,iVar2);
  this->dilation_h = iVar2;
  iVar2 = ParamDict::get(pd,3,1);
  this->stride_w = iVar2;
  iVar2 = ParamDict::get(pd,0xd,iVar2);
  this->stride_h = iVar2;
  iVar2 = ParamDict::get(pd,4,0);
  this->pad_left = iVar2;
  iVar2 = ParamDict::get(pd,0xf,iVar2);
  this->pad_right = iVar2;
  iVar2 = ParamDict::get(pd,0xe,this->pad_left);
  this->pad_top = iVar2;
  iVar2 = ParamDict::get(pd,0x10,iVar2);
  this->pad_bottom = iVar2;
  iVar2 = ParamDict::get(pd,0x12,0);
  this->output_pad_right = iVar2;
  iVar2 = ParamDict::get(pd,0x13,iVar2);
  this->output_pad_bottom = iVar2;
  iVar2 = ParamDict::get(pd,0x14,0);
  this->output_w = iVar2;
  iVar2 = ParamDict::get(pd,0x15,iVar2);
  this->output_h = iVar2;
  iVar2 = ParamDict::get(pd,5,0);
  this->bias_term = iVar2;
  iVar2 = ParamDict::get(pd,6,0);
  this->weight_data_size = iVar2;
  iVar2 = ParamDict::get(pd,7,1);
  this->group = iVar2;
  iVar2 = ParamDict::get(pd,9,0);
  this->activation_type = iVar2;
  local_68.cstep = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.d = 0;
  local_68.c = 0;
  ParamDict::get(&local_b8,pd,10,&local_68);
  piVar3 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
  if (&this->activation_params != &local_b8) {
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + 1;
      UNLOCK();
    }
    piVar3 = (this->activation_params).refcount;
    if (piVar3 != (int *)0x0) {
      LOCK();
      *piVar3 = *piVar3 + -1;
      UNLOCK();
      if (*piVar3 == 0) {
        pAVar1 = (this->activation_params).allocator;
        if (pAVar1 == (Allocator *)0x0) {
          free((this->activation_params).data);
        }
        else {
          (*pAVar1->_vptr_Allocator[3])();
        }
      }
    }
    (this->activation_params).data = local_b8.data;
    piVar3 = (int *)CONCAT44(local_b8.refcount._4_4_,local_b8.refcount._0_4_);
    (this->activation_params).refcount = piVar3;
    (this->activation_params).elemsize =
         CONCAT44(local_b8.elemsize._4_4_,(undefined4)local_b8.elemsize);
    (this->activation_params).elempack = local_b8.elempack;
    (this->activation_params).allocator = local_b8.allocator;
    (this->activation_params).dims = local_b8.dims;
    (this->activation_params).w = local_b8.w;
    (this->activation_params).h = local_b8.h;
    (this->activation_params).d = local_b8.d;
    (this->activation_params).c = local_b8.c;
    (this->activation_params).cstep = local_b8.cstep;
  }
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_b8.allocator == (Allocator *)0x0) {
        free(local_b8.data);
      }
      else {
        (*(local_b8.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  local_b8.cstep = 0;
  local_b8.data = (void *)0x0;
  local_b8.refcount._0_4_ = 0;
  local_b8.refcount._4_4_ = 0;
  local_b8.elemsize._0_4_ = 0;
  local_b8.elemsize._4_4_ = 0;
  local_b8.elempack = 0;
  local_b8.c = 0;
  local_b8.dims = 0;
  local_b8.w = 0;
  local_b8.h = 0;
  local_b8.d = 0;
  piVar3 = (int *)CONCAT44(local_68.refcount._4_4_,local_68.refcount._0_4_);
  if (piVar3 != (int *)0x0) {
    LOCK();
    *piVar3 = *piVar3 + -1;
    UNLOCK();
    if (*piVar3 == 0) {
      if (local_68.allocator == (Allocator *)0x0) {
        free(local_68.data);
      }
      else {
        (*(local_68.allocator)->_vptr_Allocator[3])();
      }
    }
  }
  iVar2 = ParamDict::get(pd,0x1c,0);
  this->dynamic_weight = iVar2;
  if (iVar2 != 0) {
    (this->super_Layer).one_blob_only = false;
  }
  return 0;
}

Assistant:

int DeconvolutionDepthWise::load_param(const ParamDict& pd)
{
    num_output = pd.get(0, 0);
    kernel_w = pd.get(1, 0);
    kernel_h = pd.get(11, kernel_w);
    dilation_w = pd.get(2, 1);
    dilation_h = pd.get(12, dilation_w);
    stride_w = pd.get(3, 1);
    stride_h = pd.get(13, stride_w);
    pad_left = pd.get(4, 0);
    pad_right = pd.get(15, pad_left);
    pad_top = pd.get(14, pad_left);
    pad_bottom = pd.get(16, pad_top);
    output_pad_right = pd.get(18, 0);
    output_pad_bottom = pd.get(19, output_pad_right);
    output_w = pd.get(20, 0);
    output_h = pd.get(21, output_w);
    bias_term = pd.get(5, 0);
    weight_data_size = pd.get(6, 0);
    group = pd.get(7, 1);
    activation_type = pd.get(9, 0);
    activation_params = pd.get(10, Mat());

    dynamic_weight = pd.get(28, 0);

    if (dynamic_weight)
    {
        one_blob_only = false;
    }

    return 0;
}